

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

int64_t PredictionCostSpatialHistogram
                  (uint32_t *accumulated,uint32_t *tile,int mode,int left_mode,int above_mode)

{
  int64_t iVar1;
  uint64_t uVar2;
  int in_ECX;
  int in_EDX;
  uint32_t *in_RSI;
  long in_RDI;
  int in_R8D;
  uint64_t kExpValue;
  int64_t retval;
  int i;
  long local_28;
  int iVar3;
  
  local_28 = 0;
  for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
    iVar1 = PredictionCostBias(in_RSI,CONCAT44(in_EDX,in_ECX),CONCAT44(in_R8D,iVar3));
    uVar2 = (*VP8LCombinedShannonEntropy)
                      (in_RSI + (iVar3 << 8),(uint32_t *)(in_RDI + (long)(iVar3 << 8) * 4));
    local_28 = uVar2 + iVar1 + local_28;
  }
  if (in_EDX == in_ECX) {
    local_28 = local_28 + -0x7800000;
  }
  if (in_EDX == in_R8D) {
    local_28 = local_28 + -0x7800000;
  }
  return local_28;
}

Assistant:

static int64_t PredictionCostSpatialHistogram(
    const uint32_t accumulated[HISTO_SIZE], const uint32_t tile[HISTO_SIZE],
    int mode, int left_mode, int above_mode) {
  int i;
  int64_t retval = 0;
  for (i = 0; i < 4; ++i) {
    const uint64_t kExpValue = 94;
    retval += PredictionCostBias(&tile[i * 256], 1, kExpValue);
    // Compute the new cost if 'tile' is added to 'accumulate' but also add the
    // cost of the current histogram to guide the spatial predictor selection.
    // Basically, favor low entropy, locally and globally.
    retval += (int64_t)VP8LCombinedShannonEntropy(&tile[i * 256],
                                                  &accumulated[i * 256]);
  }
  // Favor keeping the areas locally similar.
  if (mode == left_mode) retval -= kSpatialPredictorBias;
  if (mode == above_mode) retval -= kSpatialPredictorBias;
  return retval;
}